

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void open_cb_simple(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req->fs_type == UV_FS_OPEN) {
    if (req->result < 0) {
      fprintf(_stderr,"async open error: %d\n");
      pcVar2 = "0";
      uVar1 = 0x1be;
    }
    else {
      open_cb_count = open_cb_count + 1;
      if (req->path != (char *)0x0) {
        uv_fs_req_cleanup(req);
        return;
      }
      pcVar2 = "req->path";
      uVar1 = 0x1c1;
    }
  }
  else {
    pcVar2 = "req->fs_type == UV_FS_OPEN";
    uVar1 = 0x1bb;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar1,pcVar2);
  abort();
}

Assistant:

static void open_cb_simple(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_OPEN);
  if (req->result < 0) {
    fprintf(stderr, "async open error: %d\n", (int) req->result);
    ASSERT(0);
  }
  open_cb_count++;
  ASSERT(req->path);
  uv_fs_req_cleanup(req);
}